

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

_Bool bson_iter_init(bson_iter_t *iter,bson_t *bson)

{
  uint8_t *puVar1;
  bool bVar2;
  bson_t *bson_local;
  bson_iter_t *iter_local;
  
  if (iter == (bson_iter_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x2e,"bson_iter_init","iter");
    abort();
  }
  if (bson == (bson_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x2f,"bson_iter_init","bson");
    abort();
  }
  bVar2 = 4 < bson->len;
  if (bVar2) {
    puVar1 = bson_get_data(bson);
    iter->raw = puVar1;
    iter->len = bson->len;
    iter->off = 0;
    iter->type = 0;
    iter->key = 0;
    iter->d1 = 0;
    iter->d2 = 0;
    iter->d3 = 0;
    iter->d4 = 0;
    iter->next_off = 4;
    iter->err_off = 0;
  }
  else {
    memset(iter,0,0x50);
  }
  return bVar2;
}

Assistant:

bool
bson_iter_init (bson_iter_t *iter,  /* OUT */
                const bson_t *bson) /* IN */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (bson);

   if (BSON_UNLIKELY (bson->len < 5)) {
      memset (iter, 0, sizeof *iter);
      return false;
   }

   iter->raw = bson_get_data (bson);
   iter->len = bson->len;
   iter->off = 0;
   iter->type = 0;
   iter->key = 0;
   iter->d1 = 0;
   iter->d2 = 0;
   iter->d3 = 0;
   iter->d4 = 0;
   iter->next_off = 4;
   iter->err_off = 0;

   return true;
}